

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_server::set_static_res_dir<>
          (coro_http_server *this,string_view uri_suffix,string *file_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  path *ppVar5;
  _Path<std::__cxx11::basic_string<char>_> *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar7;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  path router_path;
  path local_170;
  string uri;
  string_view uri_suffix_local;
  string local_108;
  recursive_directory_iterator __end2;
  undefined1 local_b0 [40];
  error_code ec;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  string local_60;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  uri_suffix_local._M_str = uri_suffix._M_str;
  uri_suffix_local._M_len = uri_suffix._M_len;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (file_path,"..",0);
  bVar7 = true;
  if (sVar3 == 0xffffffffffffffff) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&uri_suffix_local,"..",0);
    bVar7 = sVar4 != 0xffffffffffffffff;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&router_path,file_path,auto_format);
  cVar2 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar2 != '\0') {
    std::filesystem::__cxx11::path::~path(&router_path);
LAB_001ad986:
    std::operator<<((ostream *)&std::cerr,"invalid file path: ");
    cerr_logger_t::operator<<((cerr_logger_t *)&router_path,file_path);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&router_path);
    exit(1);
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_170,&uri_suffix_local,auto_format);
  cVar2 = std::filesystem::__cxx11::path::has_root_path();
  std::filesystem::__cxx11::path::~path(&local_170);
  std::filesystem::__cxx11::path::~path(&router_path);
  if (bVar7 || cVar2 != '\0') goto LAB_001ad986;
  if (uri_suffix_local._M_len != 0) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&router_path,&uri_suffix_local,auto_format);
    std::filesystem::__cxx11::path::string(&local_170._M_pathname,&router_path);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->static_dir_router_path_,&local_170._M_pathname);
    std::__cxx11::string::~string((string *)&local_170);
    std::filesystem::__cxx11::path::~path(&router_path);
  }
  if (file_path->_M_string_length == 0) {
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::string(&local_108,(path *)&uri);
    std::filesystem::__cxx11::path::path(&local_170,&local_108,auto_format);
    std::filesystem::absolute(&router_path);
    std::filesystem::__cxx11::path::string((string *)&__end2,&router_path);
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_170,file_path,auto_format);
    std::filesystem::__cxx11::path::filename(&router_path,&local_170);
    std::filesystem::__cxx11::path::string(&uri,&router_path);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (file_path,&uri);
    std::__cxx11::string::~string((string *)&uri);
    std::filesystem::__cxx11::path::~path(&router_path);
    std::filesystem::__cxx11::path::~path(&local_170);
    if (file_path->_M_string_length != 0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&router_path,file_path,auto_format);
      std::filesystem::__cxx11::path::string(&local_170._M_pathname,&router_path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->static_dir_,&local_170._M_pathname);
      std::__cxx11::string::~string((string *)&local_170);
      ppVar5 = &router_path;
      goto LAB_001ad63c;
    }
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::string(&local_108,(path *)&uri);
    std::filesystem::__cxx11::path::path(&local_170,&local_108,auto_format);
    std::filesystem::absolute(&router_path);
    std::filesystem::__cxx11::path::string((string *)&__end2,&router_path);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->static_dir_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end2);
  std::__cxx11::string::~string((string *)&__end2);
  std::filesystem::__cxx11::path::~path(&router_path);
  std::filesystem::__cxx11::path::~path(&local_170);
  std::__cxx11::string::~string((string *)&local_108);
  ppVar5 = (path *)&uri;
LAB_001ad63c:
  std::filesystem::__cxx11::path::~path(ppVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->files_);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&router_path,&this->static_dir_,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_170,&router_path,&ec);
  std::filesystem::__cxx11::path::~path(&router_path);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_78,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_170);
  uri._M_dataplus._M_p = (pointer)local_78._M_ptr;
  uri._M_string_length = (size_type)local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_78);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_170);
  __end2._M_dirs._M_ptr = (element_type *)0x0;
  __end2._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_40);
  while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uri._M_string_length !=
         __end2._M_dirs._M_refcount._M_pi) {
    ppVar5 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&uri);
    if (ec._M_value == 0) {
      bVar7 = std::filesystem::__cxx11::directory_entry::is_directory((directory_entry *)ppVar5);
      if (!bVar7) {
        std::filesystem::__cxx11::path::string(&router_path._M_pathname,ppVar5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->files_,&router_path._M_pathname);
        std::__cxx11::string::~string((string *)&router_path);
      }
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&uri);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&__end2);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&uri);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_170);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&router_path,&this->static_dir_router_path_,auto_format);
  uri._M_dataplus._M_p = (pointer)&uri.field_2;
  uri._M_string_length = 0;
  uri.field_2._M_local_buf[0] = '\0';
  pbVar1 = (this->files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pbVar1; this_00 = this_00 + 1
      ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_108,this_00,(this->static_dir_)._M_string_length,0xffffffffffffffff);
    std::filesystem::__cxx11::path::path(&local_170,&local_108,auto_format);
    std::filesystem::__cxx11::path::string((string *)&__end2,&local_170);
    std::filesystem::__cxx11::path::~path(&local_170);
    std::__cxx11::string::~string((string *)&local_108);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((string *)&__end2,'\\',0);
    if (sVar3 != 0xffffffffffffffff) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"\\",&local_1a1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/",&local_1a2);
      replace_all((string *)&__end2,&local_170._M_pathname,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_170);
    }
    if ((this->static_dir_router_path_)._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&uri,(string *)&__end2);
    }
    else {
      std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
                (&local_170,(char (*) [2])0x25ff50,auto_format);
      p_Var6 = std::filesystem::__cxx11::path::append<std::__cxx11::string>
                         (&local_170,&this->static_dir_router_path_);
      p_Var6 = std::filesystem::__cxx11::path::concat<std::__cxx11::string>
                         (p_Var6,(string *)&__end2);
      std::filesystem::__cxx11::path::string(&local_108,p_Var6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&uri,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::filesystem::__cxx11::path::~path(&local_170);
    }
    std::__cxx11::string::string((string *)&local_60,&uri);
    local_b0._0_8_ = this;
    std::__cxx11::string::string((string *)(local_b0 + 8),this_00);
    set_http_handler<(cinatra::http_method)1,cinatra::coro_http_server::set_static_res_dir<>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string)::_lambda(cinatra::coro_http_request&,cinatra::coro_http_response&)_1_>
              (this,&local_60,(anon_class_40_2_16f3dfdb *)local_b0);
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&__end2);
  }
  std::__cxx11::string::~string((string *)&uri);
  std::filesystem::__cxx11::path::~path(&router_path);
  return;
}

Assistant:

void set_static_res_dir(std::string_view uri_suffix = "",
                          std::string file_path = "www", Aspects &&...aspects) {
    bool has_double_dot = (file_path.find("..") != std::string::npos) ||
                          (uri_suffix.find("..") != std::string::npos);
    if (std::filesystem::path(file_path).has_root_path() ||
        std::filesystem::path(uri_suffix).has_root_path() || has_double_dot) {
      CINATRA_LOG_ERROR << "invalid file path: " << file_path;
      std::exit(1);
    }

    if (!uri_suffix.empty()) {
      static_dir_router_path_ =
          std::filesystem::path(uri_suffix).make_preferred().string();
    }

    if (!file_path.empty()) {
      file_path = std::filesystem::path(file_path).filename().string();
      if (file_path.empty()) {
        static_dir_ = fs::absolute(fs::current_path().string()).string();
      }
      else {
        static_dir_ =
            std::filesystem::path(file_path).make_preferred().string();
      }
    }
    else {
      static_dir_ = fs::absolute(fs::current_path().string()).string();
    }

    files_.clear();
    std::error_code ec;
    for (const auto &file :
         std::filesystem::recursive_directory_iterator(static_dir_, ec)) {
      if (ec) {
        continue;
      }
      if (!file.is_directory()) {
        files_.push_back(file.path().string());
      }
    }

    std::filesystem::path router_path =
        std::filesystem::path(static_dir_router_path_);

    std::string uri;
    for (auto &file : files_) {
      auto relative_path =
          std::filesystem::path(file.substr(static_dir_.length())).string();
      if (size_t pos = relative_path.find('\\') != std::string::npos) {
        replace_all(relative_path, "\\", "/");
      }

      if (static_dir_router_path_.empty()) {
        uri = relative_path;
      }
      else {
        uri = fs::path("/")
                  .append(static_dir_router_path_)
                  .concat(relative_path)
                  .string();
      }

      set_http_handler<cinatra::GET>(
          uri,
          [this, file_name = file](
              coro_http_request &req,
              coro_http_response &resp) -> async_simple::coro::Lazy<void> {
            std::string_view extension = get_extension(file_name);
            std::string_view mime = get_mime_type(extension);
            auto range_str = req.get_header_value("Range");

            if (auto it = static_file_cache_.find(file_name);
                it != static_file_cache_.end()) {
              auto range_header = build_range_header(
                  mime, file_name, std::to_string(fs::file_size(file_name)));
              resp.set_delay(true);
              std::string &body = it->second;
              std::array<asio::const_buffer, 2> arr{asio::buffer(range_header),
                                                    asio::buffer(body)};
              co_await req.get_conn()->async_write(arr);
              co_return;
            }

            std::string content;
            detail::resize(content, chunked_size_);

            coro_io::coro_file in_file{};
            in_file.open(file_name, std::ios::in);
            if (!in_file.is_open()) {
              resp.set_status_and_content(status_type::not_found,
                                          file_name + "not found");
              co_return;
            }

            size_t file_size = fs::file_size(file_name);

            if (format_type_ == file_resp_format_type::chunked &&
                range_str.empty()) {
              resp.set_format_type(format_type::chunked);
              bool ok;
              if (ok = co_await resp.get_conn()->begin_chunked(); !ok) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                bool r = co_await resp.get_conn()->write_chunked(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  co_await resp.get_conn()->end_chunked();
                  break;
                }
              }
            }
            else {
              auto pos = range_str.find('=');
              if (pos != std::string_view::npos) {
                range_str = range_str.substr(pos + 1);
                bool is_valid = true;
                auto ranges =
                    parse_ranges(range_str, fs::file_size(file_name), is_valid);
                if (!is_valid) {
                  resp.set_status(status_type::range_not_satisfiable);
                  co_return;
                }

                assert(!ranges.empty());

                if (ranges.size() == 1) {
                  // single part
                  auto [start, end] = ranges[0];
                  in_file.seek(start, std::ios::beg);
                  size_t part_size = end + 1 - start;
                  int status = (part_size == file_size) ? 200 : 206;
                  std::string content_range = "Content-Range: bytes ";
                  content_range.append(std::to_string(start))
                      .append("-")
                      .append(std::to_string(end))
                      .append("/")
                      .append(std::to_string(file_size))
                      .append(CRCF);
                  auto range_header = build_range_header(
                      mime, file_name, std::to_string(part_size), status,
                      content_range);
                  resp.set_delay(true);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  co_await send_single_part(in_file, content, req, resp,
                                            part_size);
                }
                else {
                  // multiple ranges
                  resp.set_delay(true);
                  std::string file_size_str = std::to_string(file_size);
                  size_t content_len = 0;
                  std::vector<std::string> multi_heads = build_part_heads(
                      ranges, mime, file_size_str, content_len);
                  auto range_header = build_multiple_range_header(content_len);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  for (int i = 0; i < ranges.size(); i++) {
                    std::string &part_header = multi_heads[i];
                    r = co_await req.get_conn()->write_data(part_header);
                    if (!r) {
                      co_return;
                    }

                    auto [start, end] = ranges[i];
                    bool ok = in_file.seek(start, std::ios::beg);
                    if (!ok) {
                      resp.set_status_and_content(status_type::bad_request,
                                                  "invalid range");
                      co_await resp.get_conn()->reply();
                      co_return;
                    }
                    size_t part_size = end + 1 - start;

                    std::string_view more = CRCF;
                    if (i == ranges.size() - 1) {
                      more = MULTIPART_END;
                    }
                    r = co_await send_single_part(in_file, content, req, resp,
                                                  part_size, more);
                    if (!r) {
                      co_return;
                    }
                  }
                }
                co_return;
              }

              auto range_header = build_range_header(mime, file_name,
                                                     std::to_string(file_size));
              resp.set_delay(true);
              bool r = co_await req.get_conn()->write_data(range_header);
              if (!r) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                r = co_await req.get_conn()->write_data(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  break;
                }
              }
            }
          },
          std::forward<Aspects>(aspects)...);
    }
  }